

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_missing_file.c
# Opt level: O2

void test_missing_file(void)

{
  wchar_t wVar1;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\r',"file1",L'Ƥ',L'\xffffffff',"file1");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x0e',"file2",L'Ƥ',L'\xffffffff',"file2");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x10',"filelist1",L'Ƥ',L'\xffffffff',"file1\nfile2\n");
  wVar1 = systemf("%s -o <filelist1 >stdout1 2>stderr1",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x12',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
             ,L'\x13',"1 block\n","stderr1");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x15',"filelist2",L'Ƥ',L'\xffffffff',"file1\nfile2\nfile3\n");
  wVar1 = systemf("%s -o <filelist2 >stdout2 2>stderr2",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                   ,L'\x17',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x19',"filelist3",L'Ƥ',L'\xffffffff',"");
  wVar1 = systemf("%s -o <filelist3 >stdout3 2>stderr3",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x1b',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
             ,L'\x1c',"1 block\n","stderr3");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                      ,L'\x1e',"filelist4",L'Ƥ',L'\xffffffff',"file3\n");
  wVar1 = systemf("%s -o <filelist4 >stdout4 2>stderr4",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_missing_file.c"
                   ,L' ',(uint)(wVar1 != L'\0'),"r != 0",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_missing_file)
{
	int r;

	assertMakeFile("file1", 0644, "file1");
	assertMakeFile("file2", 0644, "file2");

	assertMakeFile("filelist1", 0644, "file1\nfile2\n");
	r = systemf("%s -o <filelist1 >stdout1 2>stderr1", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "stderr1");

	assertMakeFile("filelist2", 0644, "file1\nfile2\nfile3\n");
	r = systemf("%s -o <filelist2 >stdout2 2>stderr2", testprog);
	assert(r != 0);

	assertMakeFile("filelist3", 0644, "");
	r = systemf("%s -o <filelist3 >stdout3 2>stderr3", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "stderr3");

	assertMakeFile("filelist4", 0644, "file3\n");
	r = systemf("%s -o <filelist4 >stdout4 2>stderr4", testprog);
	assert(r != 0);
}